

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_fileio.cpp
# Opt level: O0

Result_t * __thiscall
Kumu::DirScanner::GetNext(Result_t *__return_storage_ptr__,DirScanner *this,char *filename)

{
  ILogSink *this_00;
  dirent *pdVar1;
  dirent *entry;
  char *filename_local;
  DirScanner *this_local;
  
  if (filename == (char *)0x0) {
    this_00 = DefaultLogSink();
    ILogSink::Error(this_00,"NULL pointer in file %s, line %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/KM_fileio.cpp"
                    ,0x5d1);
    Result_t::Result_t(__return_storage_ptr__,(Result_t *)RESULT_PTR);
  }
  else if (this->m_Handle == (DIR *)0x0) {
    Result_t::Result_t(__return_storage_ptr__,(Result_t *)RESULT_FILEOPEN);
  }
  else {
    pdVar1 = readdir((DIR *)this->m_Handle);
    if (pdVar1 == (dirent *)0x0) {
      Result_t::Result_t(__return_storage_ptr__,(Result_t *)RESULT_ENDOFFILE);
    }
    else {
      strncpy(filename,pdVar1->d_name,0x400);
      Result_t::Result_t(__return_storage_ptr__,(Result_t *)RESULT_OK);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result_t
Kumu::DirScanner::GetNext(char* filename)
{
  KM_TEST_NULL_L(filename);

  if ( m_Handle == NULL )
    return RESULT_FILEOPEN;

  struct dirent* entry;

  for (;;)
    {
      if ( ( entry = readdir(m_Handle)) == NULL )
	return RESULT_ENDOFFILE;

      break;
    }

  strncpy(filename, entry->d_name, MaxFilePath);
  return RESULT_OK;
}